

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O1

void __thiscall cmTarget::AppendBuildInterfaceIncludes(cmTarget *this)

{
  size_type *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  cmMakefile *this_00;
  bool bVar4;
  char *pcVar5;
  char *pcVar6;
  size_t sVar7;
  undefined8 *puVar8;
  long *plVar9;
  ulong *puVar10;
  char *pcVar11;
  undefined8 uVar12;
  ulong uVar13;
  string dirs;
  string local_d0;
  string local_b0;
  ulong *local_90;
  long local_88;
  ulong local_80;
  long lStack_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  ulong *local_50;
  long local_48;
  ulong local_40 [2];
  
  if (((INTERFACE_LIBRARY < this->TargetTypeValue) ||
      ((0x8eU >> (this->TargetTypeValue & 0x1f) & 1) == 0)) &&
     (bVar4 = IsExecutableWithExports(this), !bVar4)) {
    return;
  }
  if (this->BuildInterfaceIncludesAppended != false) {
    return;
  }
  this->BuildInterfaceIncludesAppended = true;
  this_00 = this->Makefile;
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_d0,"CMAKE_INCLUDE_CURRENT_DIR_IN_INTERFACE","");
  bVar4 = cmMakefile::IsOn(this_00,&local_d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if (!bVar4) {
    return;
  }
  pcVar5 = cmMakefile::GetCurrentBinaryDirectory(this->Makefile);
  pcVar6 = cmMakefile::GetCurrentSourceDirectory(this->Makefile);
  pcVar11 = "";
  if (pcVar5 != (char *)0x0) {
    pcVar11 = pcVar5;
  }
  local_90 = &local_80;
  sVar7 = strlen(pcVar11);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,pcVar11,pcVar11 + sVar7);
  pcVar11 = ";";
  if (pcVar5 == (char *)0x0) {
    pcVar11 = "";
  }
  paVar2 = &local_70.field_2;
  local_70._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,pcVar11,pcVar11 + (pcVar5 != (char *)0x0));
  uVar13 = 0xf;
  if (local_90 != &local_80) {
    uVar13 = local_80;
  }
  if (uVar13 < local_70._M_string_length + local_88) {
    uVar12 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != paVar2) {
      uVar12 = local_70.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar12 < local_70._M_string_length + local_88) goto LAB_0039c05d;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,(ulong)local_90);
  }
  else {
LAB_0039c05d:
    puVar8 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_90,(ulong)local_70._M_dataplus._M_p);
  }
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  puVar10 = puVar8 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar10) {
    local_b0.field_2._M_allocated_capacity = *puVar10;
    local_b0.field_2._8_8_ = puVar8[3];
  }
  else {
    local_b0.field_2._M_allocated_capacity = *puVar10;
    local_b0._M_dataplus._M_p = (pointer)*puVar8;
  }
  local_b0._M_string_length = puVar8[1];
  *puVar8 = puVar10;
  puVar8[1] = 0;
  *(undefined1 *)puVar10 = 0;
  pcVar11 = "";
  if (pcVar6 != (char *)0x0) {
    pcVar11 = pcVar6;
  }
  local_50 = local_40;
  sVar7 = strlen(pcVar11);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,pcVar11,pcVar11 + sVar7);
  paVar3 = &local_b0.field_2;
  uVar12 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar3) {
    uVar12 = local_b0.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar12 < local_48 + local_b0._M_string_length) {
    uVar13 = 0xf;
    if (local_50 != local_40) {
      uVar13 = local_40[0];
    }
    if (local_48 + local_b0._M_string_length <= uVar13) {
      puVar8 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_50,0,(char *)0x0,(ulong)local_b0._M_dataplus._M_p);
      goto LAB_0039c175;
    }
  }
  puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_b0,(ulong)local_50);
LAB_0039c175:
  psVar1 = puVar8 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1) {
    local_d0.field_2._M_allocated_capacity = *psVar1;
    local_d0.field_2._8_8_ = puVar8[3];
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  }
  else {
    local_d0.field_2._M_allocated_capacity = *psVar1;
    local_d0._M_dataplus._M_p = (pointer)*puVar8;
  }
  local_d0._M_string_length = puVar8[1];
  *puVar8 = psVar1;
  puVar8[1] = 0;
  *(undefined1 *)psVar1 = 0;
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar3) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90,local_80 + 1);
  }
  if (local_d0._M_string_length != 0) {
    local_b0._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b0,"INTERFACE_INCLUDE_DIRECTORIES","");
    std::operator+(&local_70,"$<BUILD_INTERFACE:",&local_d0);
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_70);
    puVar10 = (ulong *)(plVar9 + 2);
    if ((ulong *)*plVar9 == puVar10) {
      local_80 = *puVar10;
      lStack_78 = plVar9[3];
      local_90 = &local_80;
    }
    else {
      local_80 = *puVar10;
      local_90 = (ulong *)*plVar9;
    }
    local_88 = plVar9[1];
    *plVar9 = (long)puVar10;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    AppendProperty(this,&local_b0,(char *)local_90,false);
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != paVar2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != paVar3) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmTarget::AppendBuildInterfaceIncludes()
{
  if (this->GetType() != cmStateEnums::SHARED_LIBRARY &&
      this->GetType() != cmStateEnums::STATIC_LIBRARY &&
      this->GetType() != cmStateEnums::MODULE_LIBRARY &&
      this->GetType() != cmStateEnums::INTERFACE_LIBRARY &&
      !this->IsExecutableWithExports()) {
    return;
  }
  if (this->BuildInterfaceIncludesAppended) {
    return;
  }
  this->BuildInterfaceIncludesAppended = true;

  if (this->Makefile->IsOn("CMAKE_INCLUDE_CURRENT_DIR_IN_INTERFACE")) {
    const char* binDir = this->Makefile->GetCurrentBinaryDirectory();
    const char* srcDir = this->Makefile->GetCurrentSourceDirectory();
    const std::string dirs = std::string(binDir ? binDir : "") +
      std::string(binDir ? ";" : "") + std::string(srcDir ? srcDir : "");
    if (!dirs.empty()) {
      this->AppendProperty("INTERFACE_INCLUDE_DIRECTORIES",
                           ("$<BUILD_INTERFACE:" + dirs + ">").c_str());
    }
  }
}